

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_traits.h
# Opt level: O3

StatusOr<int>
google::protobuf::json_internal::Proto3Type::EnumNumberByName
          (Field f,string_view name,bool case_insensitive)

{
  int iVar1;
  void *pvVar2;
  void *__s1;
  char *pcVar3;
  char cVar4;
  int iVar5;
  Rep *pRVar6;
  undefined8 *puVar7;
  undefined7 in_register_00000009;
  void *__s2;
  char *__n;
  undefined8 extraout_RDX;
  char in_R8B;
  RepeatedPtrFieldBase *pRVar8;
  RepeatedPtrFieldBase *this;
  StatusOr<int> SVar9;
  StatusOr<const_google::protobuf::json_internal::ResolverPool::Enum_*> e;
  Status _status;
  Status local_88;
  anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Enum_*>_1
  local_80;
  long local_78;
  anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Enum_*>_1
  local_70;
  undefined8 local_68;
  long local_60 [2];
  InternalMetadata local_50;
  void *local_48;
  InternalMetadata *local_40;
  code *local_38;
  
  __s2 = (void *)CONCAT71(in_register_00000009,case_insensitive);
  __n = name._M_str;
  local_50.ptr_ = (intptr_t)__n;
  local_48 = __s2;
  ResolverPool::Field::EnumType((Field *)&local_80.status_);
  local_70 = local_80;
  if (((ulong)local_80 & 1) == 0) {
    LOCK();
    *(int *)local_80 = *(int *)local_80 + 1;
    UNLOCK();
  }
  if (local_80 ==
      (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Enum_*>_1
       )0x1) {
    this = (RepeatedPtrFieldBase *)(local_78 + 0x20);
    pRVar8 = this;
    if ((*(byte *)(local_78 + 0x20) & 1) != 0) {
      pRVar6 = internal::RepeatedPtrFieldBase::rep(this);
      pRVar8 = (RepeatedPtrFieldBase *)pRVar6->elements;
      if (((ulong)this->tagged_rep_or_elem_ & 1) != 0) {
        pRVar6 = internal::RepeatedPtrFieldBase::rep(this);
        this = (RepeatedPtrFieldBase *)pRVar6->elements;
      }
    }
    iVar1 = *(int *)(local_78 + 0x28);
    for (; pRVar8 != (RepeatedPtrFieldBase *)(&this->tagged_rep_or_elem_ + iVar1);
        pRVar8 = (RepeatedPtrFieldBase *)&pRVar8->current_size_) {
      pvVar2 = pRVar8->tagged_rep_or_elem_;
      puVar7 = (undefined8 *)(*(ulong *)((long)pvVar2 + 0x28) & 0xfffffffffffffffc);
      __s1 = (void *)*puVar7;
      pcVar3 = (char *)puVar7[1];
      if (in_R8B == '\0') {
        if ((pcVar3 == __n) &&
           ((__n == (char *)0x0 || (iVar5 = bcmp(__s1,__s2,(size_t)__n), iVar5 == 0))))
        goto LAB_002c962e;
      }
      else {
        cVar4 = absl::lts_20240722::EqualsIgnoreCase(pcVar3,__s1,__n,__s2);
        if (cVar4 != '\0') {
LAB_002c962e:
          *(undefined4 *)&f->raw_ = *(undefined4 *)((long)pvVar2 + 0x30);
          f->pool_ = (ResolverPool *)0x1;
          goto LAB_002c9640;
        }
      }
    }
    local_40 = &local_50;
    local_38 = absl::lts_20240722::str_format_internal::FormatArgImpl::
               Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
    absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
              (&local_70,"unknown enum value: \'%s\'",0x18,&local_40,1);
    absl::lts_20240722::InvalidArgumentError(&local_88,local_68,local_70);
    absl::lts_20240722::internal_statusor::StatusOrData<int>::
    StatusOrData<absl::lts_20240722::Status,_0>((StatusOrData<int> *)f,&local_88);
    if ((local_88.rep_ & 1) == 0) {
      absl::lts_20240722::status_internal::StatusRep::Unref();
    }
    if (local_70 !=
        (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Enum_*>_1
         )local_60) {
      operator_delete((void *)local_70,local_60[0] + 1);
    }
  }
  else {
    absl::lts_20240722::internal_statusor::StatusOrData<int>::
    StatusOrData<const_absl::lts_20240722::Status,_0>((StatusOrData<int> *)f,&local_70.status_);
    absl::lts_20240722::Status::~Status(&local_70.status_);
  }
LAB_002c9640:
  absl::lts_20240722::internal_statusor::
  StatusOrData<const_google::protobuf::json_internal::ResolverPool::Enum_*>::~StatusOrData
            ((StatusOrData<const_google::protobuf::json_internal::ResolverPool::Enum_*> *)
             &local_80.status_);
  SVar9.super_StatusOrData<int>._8_8_ = extraout_RDX;
  SVar9.super_StatusOrData<int>.field_0 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)f;
  return (StatusOr<int>)SVar9.super_StatusOrData<int>;
}

Assistant:

static absl::StatusOr<int32_t> EnumNumberByName(Field f,
                                                  absl::string_view name,
                                                  bool case_insensitive) {
    auto e = f->EnumType();
    RETURN_IF_ERROR(e.status());

    for (const auto& ev : (**e).proto().enumvalue()) {
      if (case_insensitive) {
        // Two ifs to avoid doing operator== twice if the names are not equal.
        if (absl::EqualsIgnoreCase(ev.name(), name)) {
          return ev.number();
        }
      } else if (ev.name() == name) {
        return ev.number();
      }
    }
    return absl::InvalidArgumentError(
        absl::StrFormat("unknown enum value: '%s'", name));
  }